

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int check_leafref_config(lys_node_leaf *leaf,lys_type *type)

{
  lys_node_leaf *plVar1;
  ly_ctx *ctx;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = 0;
  iVar2 = iVar6;
  if (type->base == LY_TYPE_LEAFREF) {
    if (((((leaf->flags & 1) != 0) &&
         (plVar1 = (type->info).lref.target, plVar1 != (lys_node_leaf *)0x0)) &&
        ((type->info).lref.req != -1)) && ((plVar1->flags & 2) != 0)) {
      ctx = leaf->module->ctx;
      pcVar3 = strnodetype(leaf->nodetype);
      pcVar4 = strnodetype(((type->info).lref.target)->nodetype);
      iVar2 = -1;
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_LYS,leaf,
              "The leafref %s is config but refers to a non-config %s.",pcVar3,pcVar4);
    }
  }
  else {
    iVar2 = 0;
    if ((type->base == LY_TYPE_UNION) && (iVar2 = iVar6, (type->info).bits.count != 0)) {
      lVar7 = 0;
      uVar5 = 0;
      do {
        iVar2 = check_leafref_config
                          (leaf,(lys_type *)((long)&((type->info).bits.bit)->name + lVar7));
        if (iVar2 != 0) {
          return -1;
        }
        uVar5 = uVar5 + 1;
        lVar7 = lVar7 + 0x40;
      } while (uVar5 < (type->info).bits.count);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
check_leafref_config(struct lys_node_leaf *leaf, struct lys_type *type)
{
    unsigned int i;

    if (type->base == LY_TYPE_LEAFREF) {
        if ((leaf->flags & LYS_CONFIG_W) && type->info.lref.target && type->info.lref.req != -1 &&
                (type->info.lref.target->flags & LYS_CONFIG_R)) {
            LOGVAL(leaf->module->ctx, LYE_SPEC, LY_VLOG_LYS, leaf, "The leafref %s is config but refers to a non-config %s.",
                   strnodetype(leaf->nodetype), strnodetype(type->info.lref.target->nodetype));
            return -1;
        }
        /* we can skip the test in case the leafref is not yet resolved. In that case the test is done in the time
         * of leafref resolving (lys_leaf_add_leafref_target()) */
    } else if (type->base == LY_TYPE_UNION) {
        for (i = 0; i < type->info.uni.count; i++) {
            if (check_leafref_config(leaf, &type->info.uni.types[i])) {
                return -1;
            }
        }
    }
    return 0;
}